

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

void __thiscall indk::Neuron::Entry::~Entry(Entry *this)

{
  Synapse *this_00;
  bool bVar1;
  reference ppSVar2;
  Synapse *S;
  iterator __end1;
  iterator __begin1;
  vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_> *__range1;
  Entry *this_local;
  
  __end1 = std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::begin
                     (&this->Synapses);
  S = (Synapse *)
      std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::end
                (&this->Synapses);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
                                *)&S);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppSVar2;
    if (this_00 != (Synapse *)0x0) {
      Synapse::~Synapse(this_00);
      operator_delete(this_00,0x60);
    }
    __gnu_cxx::
    __normal_iterator<indk::Neuron::Synapse_**,_std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::~vector
            (&this->Synapses);
  return;
}

Assistant:

indk::Neuron::Entry::~Entry() {
    for (auto S: Synapses) delete S;
}